

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O1

void __thiscall QPDFParser::warn(QPDFParser *this,qpdf_offset_t offset,string *msg)

{
  uint uVar1;
  uint uVar2;
  string *message;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 *puVar5;
  long *plVar6;
  uint uVar7;
  size_type *psVar8;
  qpdf_error_code_e **ppqVar9;
  ulong uVar10;
  undefined8 uVar11;
  qpdf_error_code_e *pqVar12;
  uint uVar13;
  string name;
  string __str;
  string descr;
  string local_140;
  string local_120;
  qpdf_error_code_e **local_100;
  long local_f8;
  qpdf_error_code_e *local_f0 [2];
  string local_e0;
  string *local_c0;
  qpdf_offset_t local_b8;
  undefined1 local_b0 [16];
  qpdf_error_code_e *local_a0;
  _Alloc_hider _Stack_98;
  
  if (this->stream_id == 0) {
    iVar4 = (*this->input->_vptr_InputSource[3])();
    QPDFExc::QPDFExc((QPDFExc *)local_b0,qpdf_e_damaged_pdf,(string *)CONCAT44(extraout_var,iVar4),
                     this->object_description,offset,msg);
    warn(this,(QPDFExc *)local_b0);
    QPDFExc::~QPDFExc((QPDFExc *)local_b0);
    return;
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  local_140._M_string_length = 7;
  local_140.field_2._M_allocated_capacity = 0x207463656a626f;
  uVar1 = this->obj_id;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar13 = 1;
  if (9 < uVar2) {
    uVar10 = (ulong)uVar2;
    uVar3 = 4;
    do {
      uVar13 = uVar3;
      uVar7 = (uint)uVar10;
      if (uVar7 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_001e0b05;
      }
      if (uVar7 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_001e0b05;
      }
      if (uVar7 < 10000) goto LAB_001e0b05;
      uVar10 = uVar10 / 10000;
      uVar3 = uVar13 + 4;
    } while (99999 < uVar7);
    uVar13 = uVar13 + 1;
  }
LAB_001e0b05:
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  local_b8 = offset;
  std::__cxx11::string::_M_construct((ulong)&local_120,(char)uVar13 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_120._M_dataplus._M_p + (uVar1 >> 0x1f),uVar13,uVar2);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    uVar11 = local_140.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_120._M_string_length + local_140._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      uVar11 = local_120.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_120._M_string_length + local_140._M_string_length) goto LAB_001e0b86;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_120,0,(char *)0x0,(ulong)local_140._M_dataplus._M_p);
  }
  else {
LAB_001e0b86:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_120._M_dataplus._M_p);
  }
  local_b0._0_8_ = &local_a0;
  ppqVar9 = (qpdf_error_code_e **)(puVar5 + 2);
  if ((qpdf_error_code_e **)*puVar5 == ppqVar9) {
    local_a0 = *ppqVar9;
    _Stack_98._M_p = (pointer)puVar5[3];
  }
  else {
    local_a0 = *ppqVar9;
    local_b0._0_8_ = (qpdf_error_code_e **)*puVar5;
  }
  local_b0._8_8_ = puVar5[1];
  *puVar5 = ppqVar9;
  puVar5[1] = 0;
  *(undefined1 *)ppqVar9 = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_b0);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_e0.field_2._M_allocated_capacity = *psVar8;
    local_e0.field_2._8_8_ = plVar6[3];
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar8;
    local_e0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_e0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_c0 = msg;
  if ((qpdf_error_code_e **)local_b0._0_8_ != &local_a0) {
    operator_delete((void *)local_b0._0_8_,(ulong)((long)local_a0 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  QPDF::getFilename_abi_cxx11_(&local_120,this->context);
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
  ppqVar9 = (qpdf_error_code_e **)(puVar5 + 2);
  if ((qpdf_error_code_e **)*puVar5 == ppqVar9) {
    local_a0 = *ppqVar9;
    _Stack_98._M_p = (pointer)puVar5[3];
    local_b0._0_8_ = &local_a0;
  }
  else {
    local_a0 = *ppqVar9;
    local_b0._0_8_ = (qpdf_error_code_e **)*puVar5;
  }
  local_b0._8_8_ = puVar5[1];
  *puVar5 = ppqVar9;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  uVar1 = this->stream_id;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar13 = 1;
  if (9 < uVar2) {
    uVar10 = (ulong)uVar2;
    uVar3 = 4;
    do {
      uVar13 = uVar3;
      uVar7 = (uint)uVar10;
      if (uVar7 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_001e0d7b;
      }
      if (uVar7 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_001e0d7b;
      }
      if (uVar7 < 10000) goto LAB_001e0d7b;
      uVar10 = uVar10 / 10000;
      uVar3 = uVar13 + 4;
    } while (99999 < uVar7);
    uVar13 = uVar13 + 1;
  }
LAB_001e0d7b:
  local_100 = local_f0;
  std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar13 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_100),uVar13,uVar2);
  pqVar12 = (qpdf_error_code_e *)0xf;
  if ((qpdf_error_code_e **)local_b0._0_8_ != &local_a0) {
    pqVar12 = local_a0;
  }
  if (pqVar12 < (qpdf_error_code_e *)(local_f8 + local_b0._8_8_)) {
    pqVar12 = (qpdf_error_code_e *)0xf;
    if (local_100 != local_f0) {
      pqVar12 = local_f0[0];
    }
    if ((qpdf_error_code_e *)(local_f8 + local_b0._8_8_) <= pqVar12) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,local_b0._0_8_);
      goto LAB_001e0e1a;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append(local_b0,(ulong)local_100);
LAB_001e0e1a:
  psVar8 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_140.field_2._M_allocated_capacity = *psVar8;
    local_140.field_2._8_8_ = puVar5[3];
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  }
  else {
    local_140.field_2._M_allocated_capacity = *psVar8;
    local_140._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_140._M_string_length = puVar5[1];
  *puVar5 = psVar8;
  puVar5[1] = 0;
  *(undefined1 *)psVar8 = 0;
  if (local_100 != local_f0) {
    operator_delete(local_100,(ulong)((long)local_f0[0] + 1));
  }
  if ((qpdf_error_code_e **)local_b0._0_8_ != &local_a0) {
    operator_delete((void *)local_b0._0_8_,(ulong)((long)local_a0 + 1));
  }
  message = local_c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  QPDFExc::QPDFExc((QPDFExc *)local_b0,qpdf_e_damaged_pdf,&local_140,&local_e0,local_b8,message);
  warn(this,(QPDFExc *)local_b0);
  QPDFExc::~QPDFExc((QPDFExc *)local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
QPDFParser::warn(qpdf_offset_t offset, std::string const& msg) const
{
    if (stream_id) {
        std::string descr = "object "s + std::to_string(obj_id) + " 0";
        std::string name = context->getFilename() + " object stream " + std::to_string(stream_id);
        warn(QPDFExc(qpdf_e_damaged_pdf, name, descr, offset, msg));
    } else {
        warn(QPDFExc(qpdf_e_damaged_pdf, input.getName(), object_description, offset, msg));
    }
}